

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_var_2d_u16_sse2(uint8_t *src,int src_stride,int width,int height)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined2 uVar18;
  undefined2 uVar19;
  undefined2 uVar20;
  undefined2 uVar21;
  undefined2 uVar22;
  int32_t iVar23;
  int in_ECX;
  int in_EDX;
  longlong in_RSI;
  long in_RDI;
  undefined1 auVar24 [16];
  __m128i vec_a;
  __m128i vec_a_00;
  __m128i vec_a_01;
  __m128i vec_a_02;
  uint16_t val;
  int m;
  int k_2;
  __m128i vsqs0_1;
  __m128i vsrc1_1;
  __m128i vsrc0_1;
  __m128i vsrc_1;
  __m128i vsqs0;
  __m128i vsrc1;
  __m128i vsrc0;
  int k_1;
  int k;
  __m128i vsrc [8];
  int j;
  int i;
  __m128i v_acc_sqs;
  __m128i v_acc_sum;
  __m128i vzero;
  uint64_t ss;
  uint64_t s;
  uint16_t *srcp;
  uint16_t *srcp1;
  int local_330;
  int local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int local_2b0;
  int local_2ac;
  undefined8 local_2a8 [17];
  int local_220;
  int local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  long local_1e0;
  long local_1d8;
  undefined1 (*local_1d0) [16];
  long local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 (*local_98) [16];
  undefined1 (*local_90) [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_1b4 = (int)in_RSI;
  local_1c8 = in_RDI * 2;
  local_1d8 = 0;
  local_1e0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1bc = in_ECX;
  local_1b8 = in_EDX;
  for (local_21c = 0; local_21c < local_1b8 + -8; local_21c = local_21c + 8) {
    local_1d0 = (undefined1 (*) [16])(local_1c8 + (long)local_21c * 2);
    local_220 = 0;
    while( true ) {
      uVar9 = uStack_40;
      uVar8 = local_88;
      local_88._0_2_ = (undefined2)local_1f8;
      uVar15 = (undefined2)local_88;
      local_88._2_2_ = (undefined2)((ulong)local_1f8 >> 0x10);
      uVar16 = local_88._2_2_;
      local_88._4_2_ = (undefined2)((ulong)local_1f8 >> 0x20);
      uVar17 = local_88._4_2_;
      local_88._6_2_ = (undefined2)((ulong)local_1f8 >> 0x30);
      uVar18 = local_88._6_2_;
      uStack_40._0_2_ = (undefined2)uStack_1f0;
      uVar19 = (undefined2)uStack_40;
      uStack_40._2_2_ = (undefined2)((ulong)uStack_1f0 >> 0x10);
      uVar20 = uStack_40._2_2_;
      uStack_40._4_2_ = (undefined2)((ulong)uStack_1f0 >> 0x20);
      uVar21 = uStack_40._4_2_;
      uStack_40._6_2_ = (undefined2)((ulong)uStack_1f0 >> 0x30);
      uVar22 = uStack_40._6_2_;
      local_218 = local_1f8;
      uStack_210 = uStack_1f0;
      local_208 = local_1f8;
      uStack_200 = uStack_1f0;
      if (local_1bc + -8 <= local_220) break;
      for (local_2ac = 0; local_2ac < 8; local_2ac = local_2ac + 1) {
        local_90 = local_1d0;
        uVar2 = *(undefined8 *)(*local_1d0 + 8);
        local_2a8[(long)local_2ac * 2] = *(undefined8 *)*local_1d0;
        local_2a8[(long)local_2ac * 2 + 1] = uVar2;
        local_1d0 = (undefined1 (*) [16])(*local_1d0 + (long)local_1b4 * 2);
      }
      for (local_2b0 = 0; local_2b0 < 8; local_2b0 = local_2b0 + 1) {
        uVar2 = local_2a8[(long)local_2b0 * 2];
        uStack_50 = local_2a8[(long)local_2b0 * 2 + 1];
        local_68 = local_1f8;
        uStack_60 = uStack_1f0;
        local_58._0_2_ = (undefined2)uVar2;
        local_58._2_2_ = (undefined2)((ulong)uVar2 >> 0x10);
        local_58._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_58._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
        local_18 = local_2a8[(long)local_2b0 * 2];
        uVar3 = local_2a8[(long)local_2b0 * 2 + 1];
        local_28 = local_1f8;
        uStack_20 = uStack_1f0;
        uStack_10._0_2_ = (undefined2)uVar3;
        uStack_10._2_2_ = (undefined2)((ulong)uVar3 >> 0x10);
        uStack_10._4_2_ = (undefined2)((ulong)uVar3 >> 0x20);
        uStack_10._6_2_ = (undefined2)((ulong)uVar3 >> 0x30);
        uVar12 = CONCAT26(local_88._2_2_,
                          CONCAT24(local_58._2_2_,
                                   CONCAT22((undefined2)local_88,(undefined2)local_58)));
        uVar13 = CONCAT26(local_88._6_2_,
                          CONCAT24(local_58._6_2_,CONCAT22(local_88._4_2_,local_58._4_2_)));
        uVar4 = local_208;
        uVar5 = uStack_200;
        local_f8._4_4_ = (int)((ulong)uVar12 >> 0x20);
        uStack_f0._4_4_ = (int)((ulong)uVar13 >> 0x20);
        local_108._0_4_ = (int)local_208;
        local_108._4_4_ = (int)((ulong)local_208 >> 0x20);
        uStack_100._0_4_ = (int)uStack_200;
        uStack_100._4_4_ = (int)((ulong)uStack_200 >> 0x20);
        local_108._0_4_ = CONCAT22((undefined2)local_88,(undefined2)local_58) + (int)local_108;
        uStack_100._0_4_ = CONCAT22(local_88._4_2_,local_58._4_2_) + (int)uStack_100;
        local_208 = CONCAT44(local_f8._4_4_ + local_108._4_4_,(int)local_108);
        uStack_200 = CONCAT44(uStack_f0._4_4_ + uStack_100._4_4_,(int)uStack_100);
        uVar10 = CONCAT26(uStack_40._2_2_,
                          CONCAT24(uStack_10._2_2_,
                                   CONCAT22((undefined2)uStack_40,(undefined2)uStack_10)));
        uVar11 = CONCAT26(uStack_40._6_2_,
                          CONCAT24(uStack_10._6_2_,CONCAT22(uStack_40._4_2_,uStack_10._4_2_)));
        local_128 = local_208;
        uStack_120 = uStack_200;
        local_118._4_4_ = (int)((ulong)uVar10 >> 0x20);
        uStack_110._4_4_ = (int)((ulong)uVar11 >> 0x20);
        local_208 = CONCAT44(local_118._4_4_ + local_f8._4_4_ + local_108._4_4_,
                             CONCAT22((undefined2)uStack_40,(undefined2)uStack_10) + (int)local_108)
        ;
        uStack_200 = CONCAT44(uStack_110._4_4_ + uStack_f0._4_4_ + uStack_100._4_4_,
                              CONCAT22(uStack_40._4_2_,uStack_10._4_2_) + (int)uStack_100);
        local_b8 = local_2a8[(long)local_2b0 * 2];
        uStack_b0 = local_2a8[(long)local_2b0 * 2 + 1];
        local_c8 = local_2a8[(long)local_2b0 * 2];
        uStack_c0 = local_2a8[(long)local_2b0 * 2 + 1];
        auVar14._8_8_ = uStack_b0;
        auVar14._0_8_ = local_b8;
        auVar24._8_8_ = uStack_c0;
        auVar24._0_8_ = local_c8;
        auVar24 = pmaddwd(auVar14,auVar24);
        uVar6 = local_218;
        uVar7 = uStack_210;
        local_2e8 = auVar24._0_8_;
        uStack_2e0 = auVar24._8_8_;
        local_138._0_4_ = (int)local_218;
        local_138._4_4_ = (int)((ulong)local_218 >> 0x20);
        uStack_130._0_4_ = (int)uStack_210;
        uStack_130._4_4_ = (int)((ulong)uStack_210 >> 0x20);
        local_148._0_4_ = auVar24._0_4_;
        local_148._4_4_ = auVar24._4_4_;
        uStack_140._0_4_ = auVar24._8_4_;
        uStack_140._4_4_ = auVar24._12_4_;
        local_218 = CONCAT44(local_138._4_4_ + local_148._4_4_,(int)local_138 + (int)local_148);
        uStack_210 = CONCAT44(uStack_130._4_4_ + uStack_140._4_4_,(int)uStack_130 + (int)uStack_140)
        ;
        local_148 = local_2e8;
        uStack_140 = uStack_2e0;
        local_138 = uVar6;
        uStack_130 = uVar7;
        local_118 = uVar10;
        uStack_110 = uVar11;
        local_108 = uVar4;
        uStack_100 = uVar5;
        local_f8 = uVar12;
        uStack_f0 = uVar13;
        local_58 = uVar2;
        uStack_10 = uVar3;
      }
      vec_a[1] = in_RSI;
      vec_a[0] = in_RDI;
      local_88 = uVar8;
      uStack_40 = uVar9;
      iVar23 = mm_accumulate_epi32(vec_a);
      local_1d8 = iVar23 + local_1d8;
      vec_a_00[1] = in_RSI;
      vec_a_00[0] = in_RDI;
      iVar23 = mm_accumulate_epi32(vec_a_00);
      local_1e0 = iVar23 + local_1e0;
      local_220 = local_220 + 8;
    }
    for (; uStack_40 = uVar9, local_88 = uVar8, local_220 < local_1bc; local_220 = local_220 + 1) {
      local_98 = local_1d0;
      local_e8 = *(undefined8 *)*local_1d0;
      uStack_e0 = *(undefined8 *)(*local_1d0 + 8);
      uStack_80 = uStack_1f0;
      local_78._0_2_ = (undefined2)local_e8;
      local_78._2_2_ = (undefined2)((ulong)local_e8 >> 0x10);
      local_78._4_2_ = (undefined2)((ulong)local_e8 >> 0x20);
      local_78._6_2_ = (undefined2)((ulong)local_e8 >> 0x30);
      local_48 = local_1f8;
      uStack_30._0_2_ = (undefined2)uStack_e0;
      uStack_30._2_2_ = (undefined2)((ulong)uStack_e0 >> 0x10);
      uStack_30._4_2_ = (undefined2)((ulong)uStack_e0 >> 0x20);
      uStack_30._6_2_ = (undefined2)((ulong)uStack_e0 >> 0x30);
      uVar6 = CONCAT26(uVar16,CONCAT24(local_78._2_2_,CONCAT22(uVar15,(undefined2)local_78)));
      uVar7 = CONCAT26(uVar18,CONCAT24(local_78._6_2_,CONCAT22(uVar17,local_78._4_2_)));
      uVar8 = local_208;
      uVar9 = uStack_200;
      local_158._4_4_ = (int)((ulong)uVar6 >> 0x20);
      uStack_150._4_4_ = (int)((ulong)uVar7 >> 0x20);
      local_168._0_4_ = (int)local_208;
      local_168._4_4_ = (int)((ulong)local_208 >> 0x20);
      uStack_160._0_4_ = (int)uStack_200;
      uStack_160._4_4_ = (int)((ulong)uStack_200 >> 0x20);
      local_168._0_4_ = CONCAT22(uVar15,(undefined2)local_78) + (int)local_168;
      uStack_160._0_4_ = CONCAT22(uVar17,local_78._4_2_) + (int)uStack_160;
      local_208 = CONCAT44(local_158._4_4_ + local_168._4_4_,(int)local_168);
      uStack_200 = CONCAT44(uStack_150._4_4_ + uStack_160._4_4_,(int)uStack_160);
      uVar4 = CONCAT26(uVar20,CONCAT24(uStack_30._2_2_,CONCAT22(uVar19,(undefined2)uStack_30)));
      uVar5 = CONCAT26(uVar22,CONCAT24(uStack_30._6_2_,CONCAT22(uVar21,uStack_30._4_2_)));
      local_188 = local_208;
      uStack_180 = uStack_200;
      local_178._4_4_ = (int)((ulong)uVar4 >> 0x20);
      uStack_170._4_4_ = (int)((ulong)uVar5 >> 0x20);
      local_208 = CONCAT44(local_178._4_4_ + local_158._4_4_ + local_168._4_4_,
                           CONCAT22(uVar19,(undefined2)uStack_30) + (int)local_168);
      uStack_200 = CONCAT44(uStack_170._4_4_ + uStack_150._4_4_ + uStack_160._4_4_,
                            CONCAT22(uVar21,uStack_30._4_2_) + (int)uStack_160);
      auVar24 = pmaddwd(*local_1d0,*local_1d0);
      uVar2 = local_218;
      uVar3 = uStack_210;
      local_328 = auVar24._0_8_;
      uStack_320 = auVar24._8_8_;
      local_198._0_4_ = (int)local_218;
      local_198._4_4_ = (int)((ulong)local_218 >> 0x20);
      uStack_190._0_4_ = (int)uStack_210;
      uStack_190._4_4_ = (int)((ulong)uStack_210 >> 0x20);
      local_1a8._0_4_ = auVar24._0_4_;
      local_1a8._4_4_ = auVar24._4_4_;
      uStack_1a0._0_4_ = auVar24._8_4_;
      uStack_1a0._4_4_ = auVar24._12_4_;
      local_218 = CONCAT44(local_198._4_4_ + local_1a8._4_4_,(int)local_198 + (int)local_1a8);
      uStack_210 = CONCAT44(uStack_190._4_4_ + uStack_1a0._4_4_,(int)uStack_190 + (int)uStack_1a0);
      local_1d0 = (undefined1 (*) [16])(*local_1d0 + (long)local_1b4 * 2);
      local_1a8 = local_328;
      uStack_1a0 = uStack_320;
      local_198 = uVar2;
      uStack_190 = uVar3;
      local_178 = uVar4;
      uStack_170 = uVar5;
      local_168 = uVar8;
      uStack_160 = uVar9;
      local_158 = uVar6;
      uStack_150 = uVar7;
      local_d8 = local_e8;
      uStack_d0 = uStack_e0;
      uVar8 = local_1f8;
      local_78 = local_e8;
      uStack_70 = uStack_e0;
      uVar9 = uStack_1f0;
      local_38 = local_e8;
      uStack_30 = uStack_e0;
    }
    vec_a_01[1] = in_RSI;
    vec_a_01[0] = in_RDI;
    iVar23 = mm_accumulate_epi32(vec_a_01);
    local_1d8 = iVar23 + local_1d8;
    vec_a_02[1] = in_RSI;
    vec_a_02[0] = in_RDI;
    iVar23 = mm_accumulate_epi32(vec_a_02);
    local_1e0 = iVar23 + local_1e0;
  }
  local_1d0 = (undefined1 (*) [16])local_1c8;
  for (local_32c = 0; local_32c < local_1bc; local_32c = local_32c + 1) {
    for (local_330 = local_21c; local_330 < local_1b8; local_330 = local_330 + 1) {
      uVar1 = *(ushort *)((long)local_1d0 + (long)local_330 * 2);
      local_1d8 = (ulong)uVar1 + local_1d8;
      local_1e0 = (int)((uint)uVar1 * (uint)uVar1) + local_1e0;
    }
    local_1d0 = (undefined1 (*) [16])((long)local_1d0 + (long)local_1b4 * 2);
  }
  return local_1e0 - (ulong)(local_1d8 * local_1d8) / (ulong)(long)(local_1b8 * local_1bc);
}

Assistant:

uint64_t aom_var_2d_u16_sse2(uint8_t *src, int src_stride, int width,
                             int height) {
  uint16_t *srcp1 = CONVERT_TO_SHORTPTR(src), *srcp;
  uint64_t s = 0, ss = 0;
  __m128i vzero = _mm_setzero_si128();
  __m128i v_acc_sum = vzero;
  __m128i v_acc_sqs = vzero;
  int i, j;

  // Process 8 elements in a row
  for (i = 0; i < width - 8; i += 8) {
    srcp = srcp1 + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 8; j += 8) {
      __m128i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm_loadu_si128((__m128i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m128i vsrc0 = _mm_unpacklo_epi16(vsrc[k], vzero);
        __m128i vsrc1 = _mm_unpackhi_epi16(vsrc[k], vzero);
        v_acc_sum = _mm_add_epi32(vsrc0, v_acc_sum);
        v_acc_sum = _mm_add_epi32(vsrc1, v_acc_sum);

        __m128i vsqs0 = _mm_madd_epi16(vsrc[k], vsrc[k]);
        v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
      }

      // Update total sum and clear the vectors
      s += mm_accumulate_epi32(v_acc_sum);
      ss += mm_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m128i vsrc = _mm_loadu_si128((__m128i *)srcp);
      __m128i vsrc0 = _mm_unpacklo_epi16(vsrc, vzero);
      __m128i vsrc1 = _mm_unpackhi_epi16(vsrc, vzero);
      v_acc_sum = _mm_add_epi32(vsrc0, v_acc_sum);
      v_acc_sum = _mm_add_epi32(vsrc1, v_acc_sum);

      __m128i vsqs0 = _mm_madd_epi16(vsrc, vsrc);
      v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm_accumulate_epi32(v_acc_sum);
    ss += mm_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = srcp1;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint16_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}